

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

void __thiscall
leveldb::InternalKeyComparator::FindShortSuccessor(InternalKeyComparator *this,string *key)

{
  int iVar1;
  string *dst;
  size_t sVar2;
  ulong uVar3;
  string *in_RSI;
  long in_RDI;
  bool bVar4;
  string tmp;
  Slice user_key;
  string *in_stack_ffffffffffffff68;
  Slice *in_stack_ffffffffffffff70;
  undefined1 local_68 [23];
  allocator local_51;
  string local_50 [48];
  Slice local_20;
  string *local_10;
  
  local_10 = in_RSI;
  Slice::Slice(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_20 = ExtractUserKey(in_stack_ffffffffffffff70);
  dst = (string *)Slice::data(&local_20);
  sVar2 = Slice::size(&local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,(char *)dst,sVar2,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  (**(code **)(**(long **)(in_RDI + 8) + 0x28))(*(long **)(in_RDI + 8),local_50);
  uVar3 = std::__cxx11::string::size();
  sVar2 = Slice::size(&local_20);
  bVar4 = false;
  if (uVar3 < sVar2) {
    in_stack_ffffffffffffff68 = *(string **)(in_RDI + 8);
    Slice::Slice((Slice *)dst,in_stack_ffffffffffffff68);
    iVar1 = (**(code **)(*(long *)in_stack_ffffffffffffff68 + 0x10))
                      (in_stack_ffffffffffffff68,&local_20,local_68);
    bVar4 = iVar1 < 0;
  }
  if (bVar4) {
    PackSequenceAndType(0xffffffffffffff,kTypeValue);
    PutFixed64(dst,(uint64_t)in_stack_ffffffffffffff68);
    std::__cxx11::string::swap(local_10);
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void InternalKeyComparator::FindShortSuccessor(std::string* key) const {
  Slice user_key = ExtractUserKey(*key);
  std::string tmp(user_key.data(), user_key.size());
  user_comparator_->FindShortSuccessor(&tmp);
  if (tmp.size() < user_key.size() &&
      user_comparator_->Compare(user_key, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*key, tmp) < 0);
    key->swap(tmp);
  }
}